

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O2

Matrix33<float> * __thiscall
Imath_3_2::Euler<float>::toMatrix33(Matrix33<float> *__return_storage_ptr__,Euler<float> *this)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  int k;
  int j;
  int i;
  int local_64;
  int local_60;
  int local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  float local_28;
  
  angleOrder(this,&local_5c,&local_60,&local_64);
  bVar1 = this->field_0xc;
  fVar5 = (&(this->super_Vec3<float>).x)[(ulong)(bVar1 & 1) * 2];
  fVar6 = (this->super_Vec3<float>).y;
  local_38 = (&(this->super_Vec3<float>).x)[(ulong)((byte)~bVar1 & 1) * 2];
  uStack_34 = 0x80000000;
  uStack_30 = 0x80000000;
  uStack_2c = 0x80000000;
  if ((bVar1 & 4) == 0) {
    local_38 = -local_38;
    local_58._4_4_ = 0x80000000;
    local_58._0_4_ = -fVar6;
    local_58._8_4_ = 0x80000000;
    local_58._12_4_ = 0x80000000;
    local_48._4_4_ = 0x80000000;
    local_48._0_4_ = -fVar5;
    local_48._8_4_ = 0x80000000;
    local_48._12_4_ = 0x80000000;
  }
  else {
    local_48 = ZEXT416((uint)fVar5);
    local_58 = ZEXT416((uint)fVar6);
    uStack_34 = 0;
    uStack_30 = 0;
    uStack_2c = 0;
  }
  fVar5 = cosf(local_38);
  local_28 = cosf((float)local_58._0_4_);
  fVar6 = cosf((float)local_48._0_4_);
  local_38 = sinf(local_38);
  local_58._0_4_ = sinf((float)local_58._0_4_);
  local_58._4_4_ = extraout_XMM0_Db;
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._12_4_ = extraout_XMM0_Dd;
  fVar7 = sinf((float)local_48._0_4_);
  local_48._0_4_ = fVar5 * fVar6;
  fVar8 = fVar5 * fVar7;
  fVar9 = fVar6 * local_38;
  fVar10 = local_38 * fVar7;
  Matrix33<float>::Matrix33(__return_storage_ptr__);
  if ((this->field_0xc & 2) == 0) {
    lVar2 = (long)local_5c;
    *(float *)((long)__return_storage_ptr__->x + lVar2 * 0x10) = fVar6 * local_28;
    lVar3 = (long)local_60;
    __return_storage_ptr__->x[lVar3][lVar2] = (float)local_58._0_4_ * fVar9 - fVar8;
    lVar4 = (long)local_64;
    __return_storage_ptr__->x[lVar4][lVar2] = (float)local_58._0_4_ * (float)local_48._0_4_ + fVar10
    ;
    __return_storage_ptr__->x[lVar2][lVar3] = fVar7 * local_28;
    *(float *)((long)__return_storage_ptr__->x + lVar3 * 0x10) =
         fVar10 * (float)local_58._0_4_ + (float)local_48._0_4_;
    __return_storage_ptr__->x[lVar4][lVar3] = (float)local_58._0_4_ * fVar8 - fVar9;
    __return_storage_ptr__->x[lVar2][lVar4] = -(float)local_58._0_4_;
    __return_storage_ptr__->x[lVar3][lVar4] = local_38 * local_28;
    *(float *)((long)__return_storage_ptr__->x + lVar4 * 0x10) = fVar5 * local_28;
  }
  else {
    lVar3 = (long)local_5c;
    *(float *)((long)__return_storage_ptr__->x + lVar3 * 0x10) = local_28;
    lVar4 = (long)local_60;
    __return_storage_ptr__->x[lVar4][lVar3] = local_38 * (float)local_58._0_4_;
    lVar2 = (long)local_64;
    __return_storage_ptr__->x[lVar2][lVar3] = fVar5 * (float)local_58._0_4_;
    __return_storage_ptr__->x[lVar3][lVar4] = fVar7 * (float)local_58._0_4_;
    *(float *)((long)__return_storage_ptr__->x + lVar4 * 0x10) =
         (float)local_48._0_4_ - local_28 * fVar10;
    __return_storage_ptr__->x[lVar2][lVar4] = -local_28 * fVar8 - fVar9;
    __return_storage_ptr__->x[lVar3][lVar2] = fVar6 * -(float)local_58._0_4_;
    __return_storage_ptr__->x[lVar4][lVar2] = fVar9 * local_28 + fVar8;
    *(float *)((long)__return_storage_ptr__->x + lVar2 * 0x10) =
         local_28 * (float)local_48._0_4_ - fVar10;
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE Matrix33<T>
                 Euler<T>::toMatrix33 () const IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    Vec3<T> angles;

    if (_frameStatic)
        angles = (*this);
    else
        angles = Vec3<T> (z, y, x);

    if (!_parityEven) angles *= -1.0;

    T ci = std::cos (angles.x);
    T cj = std::cos (angles.y);
    T ch = std::cos (angles.z);
    T si = std::sin (angles.x);
    T sj = std::sin (angles.y);
    T sh = std::sin (angles.z);

    T cc = ci * ch;
    T cs = ci * sh;
    T sc = si * ch;
    T ss = si * sh;

    Matrix33<T> M;

    if (_initialRepeated)
    {
        M[i][i] = cj;
        M[j][i] = sj * si;
        M[k][i] = sj * ci;
        M[i][j] = sj * sh;
        M[j][j] = -cj * ss + cc;
        M[k][j] = -cj * cs - sc;
        M[i][k] = -sj * ch;
        M[j][k] = cj * sc + cs;
        M[k][k] = cj * cc - ss;
    }
    else
    {
        M[i][i] = cj * ch;
        M[j][i] = sj * sc - cs;
        M[k][i] = sj * cc + ss;
        M[i][j] = cj * sh;
        M[j][j] = sj * ss + cc;
        M[k][j] = sj * cs - sc;
        M[i][k] = -sj;
        M[j][k] = cj * si;
        M[k][k] = cj * ci;
    }

    return M;
}